

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blt_gtest_smoke.cpp
# Opt level: O2

void __thiscall
blt_gtest_smoke_death_test_Test::~blt_gtest_smoke_death_test_Test
          (blt_gtest_smoke_death_test_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(blt_gtest_smoke,death_test)
{
  #if (GTEST_HAS_DEATH_TEST == 0)
  std::cout <<"Note: Death tests disabled in this configuration." << std::endl;
  #endif

  // Invoke death test function whether death tests enabled or disabled.
  ::testing::FLAGS_gtest_death_test_style = "threadsafe";
  EXPECT_DEATH_IF_SUPPORTED( exit(1), "");
}